

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.cpp
# Opt level: O1

unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
license::CryptoHelper::getInstance(void)

{
  CryptoHelperLinux *this;
  __uniq_ptr_data<license::CryptoHelper,_std::default_delete<license::CryptoHelper>,_true,_true>
  in_RDI;
  
  this = (CryptoHelperLinux *)operator_new(0x10);
  CryptoHelperLinux::CryptoHelperLinux(this);
  *(CryptoHelperLinux **)
   in_RDI.super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>.
   _M_t.super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>
   .super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<license::CryptoHelper,_std::default_delete<license::CryptoHelper>,_true,_true>
          )(tuple<license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>)
           in_RDI.
           super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
           ._M_t.
           super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>
           .super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CryptoHelper> CryptoHelper::getInstance() {
#ifdef HAS_OPENSSL
	unique_ptr<CryptoHelper> ptr((CryptoHelper *)new CryptoHelperLinux());
#else
	unique_ptr<CryptoHelper> ptr((CryptoHelper *)new CryptoHelperWindows());
#endif
	return ptr;
}